

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O3

TConstUnion * __thiscall
glslang::TAttributeArgs::getConstUnion(TAttributeArgs *this,TBasicType basicType,int argNum)

{
  TConstUnion *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  undefined4 extraout_var_01;
  
  if ((this->args != (TIntermAggregate *)0x0) &&
     (iVar2 = (*(this->args->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x33])(),
     argNum < (int)((ulong)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) -
                           *(long *)(CONCAT44(extraout_var,iVar2) + 8)) >> 3))) {
    iVar2 = (*(this->args->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x33])();
    lVar3 = (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 8) +
                                    (long)argNum * 8) + 0x28))();
    if (lVar3 != 0) {
      iVar2 = (*(this->args->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x33])();
      lVar3 = (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_01,iVar2) + 8) +
                                      (long)argNum * 8) + 0x28))();
      pTVar1 = *(TConstUnion **)(*(long *)(lVar3 + 0xc0) + 8);
      if (pTVar1->type != basicType) {
        return (TConstUnion *)0x0;
      }
      return pTVar1;
    }
  }
  return (TConstUnion *)0x0;
}

Assistant:

const TConstUnion* TAttributeArgs::getConstUnion(TBasicType basicType, int argNum) const
{
    if (args == nullptr)
        return nullptr;

    if (argNum >= (int)args->getSequence().size())
        return nullptr;

    if (args->getSequence()[argNum]->getAsConstantUnion() == nullptr)
        return nullptr;

    const TConstUnion* constVal = &args->getSequence()[argNum]->getAsConstantUnion()->getConstArray()[0];
    if (constVal == nullptr || constVal->getType() != basicType)
        return nullptr;

    return constVal;
}